

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall
pugi::xml_node::insert_copy_before(xml_node *this,xml_node *proto,xml_node *node)

{
  xml_node_type type_;
  unspecified_bool_type p_Var1;
  xml_node *node_local;
  xml_node *proto_local;
  xml_node *this_local;
  xml_node result;
  
  type_ = type(proto);
  this_local = (xml_node *)insert_child_before(this,type_,node);
  p_Var1 = operator_cast_to_function_pointer((xml_node *)&this_local);
  if (p_Var1 != (unspecified_bool_type)0x0) {
    impl::anon_unknown_0::recursive_copy_skip((xml_node *)&this_local,proto,(xml_node *)&this_local)
    ;
  }
  return (xml_node)(xml_node_struct *)this_local;
}

Assistant:

PUGI__FN xml_node xml_node::insert_copy_before(const xml_node& proto, const xml_node& node)
	{
		xml_node result = insert_child_before(proto.type(), node);

		if (result) impl::recursive_copy_skip(result, proto, result);

		return result;
	}